

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfor.h
# Opt level: O2

uint32_t __thiscall
FastPForLib::PFor::compressblockPFOR
          (PFor *this,DATATYPE *in,uint32_t *outputbegin,uint32_t b,DATATYPE **exceptions)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  uint uVar2;
  uint uVar3;
  pointer puVar4;
  uint uVar5;
  size_t k;
  long lVar6;
  uint *puVar7;
  ulong uVar8;
  uint *puVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  
  if (b == 0x20) {
    for (lVar6 = 0; lVar6 != 0x80; lVar6 = lVar6 + 1) {
      outputbegin[lVar6] = in[lVar6];
    }
    return 0x80;
  }
  uVar10 = 1;
  puVar4 = (this->miss).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar11 = 1 << (b & 0x1f);
  uVar13 = 0;
  for (lVar6 = 0; lVar6 != 0x80; lVar6 = lVar6 + 1) {
    puVar4[uVar13] = (uint)lVar6;
    uVar13 = (uVar13 + 1) - (ulong)(in[lVar6] < uVar11);
  }
  if (uVar13 == 0) {
    packblock(this,in,outputbegin,b);
    uVar5 = 0x80;
  }
  else {
    pvVar1 = &this->codedcopy;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)pvVar1,in,in + 0x80);
    uVar5 = *(this->miss).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = (ulong)uVar5;
    puVar9 = *exceptions;
    uVar2 = (this->codedcopy).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8];
    puVar7 = puVar9 + 1;
    *exceptions = puVar7;
    *puVar9 = uVar2;
    if (b < 7) {
      for (uVar10 = 1; uVar10 < uVar13; uVar10 = (ulong)((int)uVar10 + 1)) {
        uVar2 = (this->miss).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start[uVar10];
        puVar9 = puVar7;
        while( true ) {
          puVar7 = puVar9 + 1;
          puVar4 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          uVar12 = (uint)uVar8 + uVar11;
          if (uVar2 <= uVar12) break;
          uVar3 = puVar4[uVar12];
          *exceptions = puVar7;
          *puVar9 = uVar3;
          (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar8] = uVar11 - 1;
          uVar8 = (ulong)uVar12;
          puVar9 = puVar7;
        }
        uVar12 = puVar4[uVar2];
        *exceptions = puVar7;
        *puVar9 = uVar12;
        (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar8] = ~(uint)uVar8 + uVar2;
        uVar8 = (ulong)uVar2;
      }
    }
    else {
      puVar9 = puVar9 + 2;
      for (; uVar10 < uVar13; uVar10 = (ulong)((int)uVar10 + 1)) {
        uVar11 = (this->miss).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar10];
        uVar2 = (this->codedcopy).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar11];
        *exceptions = puVar9;
        puVar9[-1] = uVar2;
        puVar9 = puVar9 + 1;
        (this->codedcopy).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar8] = ~(uint)uVar8 + uVar11;
        uVar8 = (ulong)uVar11;
      }
    }
    packblock(this,(this->codedcopy).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_start,outputbegin,b);
  }
  return uVar5;
}

Assistant:

uint32_t compressblockPFOR(const DATATYPE *__restrict__ in,
                             uint32_t *__restrict__ outputbegin,
                             const uint32_t b,
                             DATATYPE *__restrict__ &exceptions) {
    if (b == 32) {
      for (size_t k = 0; k < BlockSize; ++k)
        *(outputbegin++) = *(in++);
      return BlockSize;
    }
    size_t exceptcounter = 0;
    const uint32_t maxgap = 1U << b;
    {
      std::vector<uint32_t>::iterator cci = codedcopy.begin();
      for (uint32_t k = 0; k < BlockSize; ++k, ++cci) {
        miss[exceptcounter] = k;
        exceptcounter += (in[k] >= maxgap);
      }
    }
    if (exceptcounter == 0) {
      packblock(in, outputbegin, b);
      return BlockSize;
    }
    codedcopy.assign(in, in + BlockSize);
    uint32_t firstexcept = miss[0];
    uint32_t prev = 0;
    *(exceptions++) = codedcopy[firstexcept];
    prev = firstexcept;
    if (maxgap < BlockSize) {
      for (uint32_t i = 1; i < exceptcounter; ++i) {
        uint32_t cur = miss[i];
        // they don't include this part, but it is required:
        while (cur > maxgap + prev) {
          // compulsory exception
          uint32_t compulcur = prev + maxgap;
          *(exceptions++) = codedcopy[compulcur];
          codedcopy[prev] = maxgap - 1;
          prev = compulcur;
        }
        *(exceptions++) = codedcopy[cur];
        codedcopy[prev] = cur - prev - 1;
        prev = cur;
      }
    } else {
      for (uint32_t i = 1; i < exceptcounter; ++i) {
        uint32_t cur = miss[i];
        *(exceptions++) = codedcopy[cur];
        codedcopy[prev] = cur - prev - 1;
        prev = cur;
      }
    }
    packblock(&codedcopy[0], outputbegin, b);
    return firstexcept;
  }